

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

N_Vector N_VClone_SensWrapper(N_Vector w)

{
  N_Vector p_Var1;
  N_Vector p_Var2;
  int i;
  N_Vector v;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  N_Vector in_stack_fffffffffffffff8;
  
  p_Var1 = N_VCloneEmpty_SensWrapper(in_stack_fffffffffffffff8);
  if (p_Var1 == (N_Vector)0x0) {
    p_Var1 = (N_Vector)0x0;
  }
  else {
    *(undefined4 *)((long)p_Var1->content + 0xc) = 1;
    for (iVar3 = 0; iVar3 < *(int *)((long)p_Var1->content + 8); iVar3 = iVar3 + 1) {
      p_Var2 = N_VClone((N_Vector)CONCAT44(iVar3,in_stack_ffffffffffffffe0));
      *(N_Vector *)(*p_Var1->content + (long)iVar3 * 8) = p_Var2;
      if (*(long *)(*p_Var1->content + (long)iVar3 * 8) == 0) {
        N_VDestroy((N_Vector)0xeea2c0);
        return (N_Vector)0x0;
      }
    }
  }
  return p_Var1;
}

Assistant:

N_Vector N_VClone_SensWrapper(N_Vector w)
{
  N_Vector v;
  int i;

  /* create empty wrapper */
  v = NULL;
  v = N_VCloneEmpty_SensWrapper(w);
  if (v == NULL) return(NULL);

  /* update own vectors status */
  NV_OWN_VECS_SW(v) = SUNTRUE;

  /* allocate arrays */
  for (i=0; i < NV_NVECS_SW(v); i++) {
    NV_VEC_SW(v,i) = N_VClone(NV_VEC_SW(w,i));
    if (NV_VEC_SW(v,i) == NULL) { N_VDestroy(v); return(NULL); }
  }

  return(v);
}